

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

bool __thiscall
InvariantBlockBackwardIterator::UpdatePredBlockBV(InvariantBlockBackwardIterator *this)

{
  BVSparse<Memory::JitArenaAllocator> *this_00;
  code *pcVar1;
  bool bVar2;
  BOOLEAN BVar3;
  undefined4 *puVar4;
  Type *ppFVar5;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *pSVar6;
  Iterator local_40;
  
  if (this->followFlow == true) {
    this_00 = &this->blockBV;
    bVar2 = BVSparse<Memory::JitArenaAllocator>::IsEmpty(this_00);
    if ((!bVar2) &&
       (BVar3 = BVSparse<Memory::JitArenaAllocator>::Test(this_00,this->block->number),
       BVar3 == '\0')) {
      return false;
    }
    pSVar6 = &(this->block->predList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>
    ;
    local_40.list = pSVar6;
    local_40.current = &pSVar6->super_SListNodeBase<Memory::ArenaAllocator>;
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    while( true ) {
      if (pSVar6 == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
        pSVar6 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_40.current;
      }
      local_40.current =
           (((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
            &pSVar6->super_SListNodeBase<Memory::ArenaAllocator>)->
           super_SListNodeBase<Memory::ArenaAllocator>).next;
      if ((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_40.current ==
          local_40.list) break;
      ppFVar5 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data(&local_40);
      BVSparse<Memory::JitArenaAllocator>::Set(this_00,(*ppFVar5)->predBlock->number);
      pSVar6 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_40.current;
    }
  }
  return true;
}

Assistant:

bool
InvariantBlockBackwardIterator::UpdatePredBlockBV()
{
    if (!this->followFlow)
    {
        return true;
    }

    // Track blocks we've visited to ensure that we only iterate over predecessor blocks
    if (!this->blockBV.IsEmpty() && !this->blockBV.Test(this->block->GetBlockNum()))
    {
        return false;
    }

    FOREACH_SLISTBASECOUNTED_ENTRY(FlowEdge*, edge, this->block->GetPredList())
    {
        this->blockBV.Set(edge->GetPred()->GetBlockNum());
    } NEXT_SLISTBASECOUNTED_ENTRY;

    return true;
}